

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

size_t luaO_str2num(char *s,TValue *o)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  lconv *plVar7;
  int mode;
  int mode_00;
  lua_Number lVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  lua_Number n;
  char local_108 [216];
  
  pbVar10 = (byte *)s;
  do {
    pbVar11 = pbVar10;
    bVar1 = *pbVar11;
    uVar4 = (ulong)bVar1;
    pbVar10 = pbVar11 + 1;
  } while ((""[uVar4 + 1] & 8) != 0);
  if (bVar1 == 0x2b) {
    iVar9 = 0;
LAB_00110c91:
    uVar4 = (ulong)*pbVar10;
    pbVar11 = pbVar10;
  }
  else {
    if (bVar1 == 0x2d) {
      iVar9 = 1;
      goto LAB_00110c91;
    }
    iVar9 = 0;
  }
  if (((char)uVar4 == '0') && ((pbVar11[1] | 0x20) == 0x78)) {
    pbVar11 = pbVar11 + 2;
    bVar2 = true;
    lVar8 = 0.0;
    while( true ) {
      if ((""[(ulong)*pbVar11 + 1] & 0x10) == 0) break;
      iVar3 = luaO_hexavalue((int)(char)*pbVar11);
      lVar8 = (lua_Number)((long)lVar8 * 0x10 + (long)iVar3);
      pbVar11 = pbVar11 + 1;
      bVar2 = false;
    }
  }
  else {
    bVar2 = true;
    lVar8 = 0.0;
    while( true ) {
      if ((""[uVar4 + 1] & 2) == 0) break;
      iVar3 = (char)uVar4 + -0x30;
      if ((0xccccccccccccccb < (ulong)lVar8) &&
         ((lVar8 != 5.1488004017107686e-247 || (iVar9 + 7 < iVar3)))) goto LAB_00110d53;
      lVar8 = (lua_Number)((long)iVar3 + (long)lVar8 * 10);
      uVar4 = (ulong)pbVar11[1];
      pbVar11 = pbVar11 + 1;
      bVar2 = false;
    }
  }
  pbVar11 = pbVar11 + -1;
  do {
    pbVar10 = pbVar11 + 1;
    pbVar11 = pbVar11 + 1;
  } while ((""[(ulong)*pbVar10 + 1] & 8) != 0);
  if ((bVar2) || (*pbVar10 != 0)) {
LAB_00110d53:
    pbVar10 = (byte *)strpbrk(s,".xXnN");
    if ((pbVar10 == (byte *)0x0) || ((*pbVar10 & 0xdf) != 0x4e)) {
      pbVar11 = (byte *)l_str2dloc(s,&n,mode);
      if (pbVar11 != (byte *)0x0) {
LAB_00110d88:
        iVar9 = 3;
        goto LAB_00110d90;
      }
      pcVar5 = strchr(s,0x2e);
      sVar6 = strlen(s);
      if (pcVar5 != (char *)0x0 && sVar6 < 0xc9) {
        strcpy(local_108,s);
        plVar7 = localeconv();
        pcVar5[(long)(local_108 + -(long)s)] = *plVar7->decimal_point;
        pcVar5 = l_str2dloc(local_108,&n,mode_00);
        if ((pcVar5 != (char *)0x0) && (s != (char *)0x0)) {
          pbVar11 = (byte *)(s + ((long)pcVar5 - (long)local_108));
          goto LAB_00110d88;
        }
      }
    }
    pbVar11 = (byte *)0x0;
  }
  else {
    n = (lua_Number)-(long)lVar8;
    if (iVar9 == 0) {
      n = lVar8;
    }
    iVar9 = 0x13;
LAB_00110d90:
    (o->value_).i = (lua_Integer)n;
    o->tt_ = iVar9;
    pbVar11 = pbVar11 + (1 - (long)s);
  }
  return (size_t)pbVar11;
}

Assistant:

size_t luaO_str2num(const char *s, TValue *o) {
    lua_Integer i;
    lua_Number n;
    const char *e;
    if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
        setivalue(o, i);
    } else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
        setfltvalue(o, n);
    } else
        return 0;  /* conversion failed */
    return (e - s) + 1;  /* success; return string size */
}